

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_connection.c
# Opt level: O0

apx_error_t process_disconnected_provider_nodes(adt_ary_t *provider_change_array)

{
  apx_size_t aVar1;
  apx_nodeInstance_t *self;
  long lVar2;
  apx_dataState_t aVar3;
  int32_t iVar4;
  apx_size_t aVar5;
  void *pvVar6;
  apx_portConnectorChangeRef_t *ref;
  apx_portConnectorChangeTable_t *connector_changes;
  apx_nodeInstance_t *provider_node_instance;
  int32_t i;
  int32_t numNodes;
  adt_ary_t *provider_change_array_local;
  
  if (provider_change_array == (adt_ary_t *)0x0) {
    __assert_fail("provider_change_array != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server_connection.c"
                  ,0x2c6,"apx_error_t process_disconnected_provider_nodes(adt_ary_t *)");
  }
  iVar4 = adt_ary_length(provider_change_array);
  provider_node_instance._0_4_ = 0;
  while( true ) {
    if (iVar4 <= (int)provider_node_instance) {
      return 0;
    }
    pvVar6 = adt_ary_value(provider_change_array,(int)provider_node_instance);
    self = *(apx_nodeInstance_t **)((long)pvVar6 + 8);
    lVar2 = *(long *)((long)pvVar6 + 0x10);
    aVar3 = apx_nodeInstance_get_provide_port_data_state(self);
    if (aVar3 != '\x04') break;
    aVar1 = *(apx_size_t *)(lVar2 + 8);
    aVar5 = apx_nodeInstance_get_num_provide_ports(self);
    if (aVar1 != aVar5) {
      __assert_fail("connector_changes->num_ports == apx_nodeInstance_get_num_provide_ports(provider_node_instance)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server_connection.c"
                    ,0x2d0,"apx_error_t process_disconnected_provider_nodes(adt_ary_t *)");
    }
    apx_nodeInstance_clear_connector_table(self);
    apx_nodeInstance_set_provide_port_data_state(self,'\x05');
    provider_node_instance._0_4_ = (int)provider_node_instance + 1;
  }
  __assert_fail("apx_nodeInstance_get_provide_port_data_state(provider_node_instance) == APX_DATA_STATE_CONNECTED"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server_connection.c"
                ,0x2cf,"apx_error_t process_disconnected_provider_nodes(adt_ary_t *)");
}

Assistant:

static apx_error_t process_disconnected_provider_nodes(adt_ary_t* provider_change_array)
{
   int32_t numNodes;
   int32_t i;
   assert(provider_change_array != 0);
   numNodes = adt_ary_length(provider_change_array);
   for (i = 0; i < numNodes; i++)
   {
      apx_nodeInstance_t* provider_node_instance;
      apx_portConnectorChangeTable_t* connector_changes;
      apx_portConnectorChangeRef_t* ref = (apx_portConnectorChangeRef_t*)adt_ary_value(provider_change_array, i);
      provider_node_instance = ref->node_instance;
      connector_changes = ref->connector_changes;
      assert(apx_nodeInstance_get_provide_port_data_state(provider_node_instance) == APX_DATA_STATE_CONNECTED);
      assert(connector_changes->num_ports == apx_nodeInstance_get_num_provide_ports(provider_node_instance));
      apx_nodeInstance_clear_connector_table(provider_node_instance);
      apx_nodeInstance_set_provide_port_data_state(provider_node_instance, APX_DATA_STATE_DISCONNECTED);
   }
   return APX_NO_ERROR;
}